

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::DitheringCase::iterate(DitheringCase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  Vec4 quadColor;
  
  if (this->m_patternType == PATTERNTYPE_GRADIENT) {
    bVar1 = drawAndCheckGradient(this,this->m_iteration == 1,&this->m_color);
    if (bVar1) {
      iVar2 = this->m_iteration;
      if (iVar2 == 1) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      goto LAB_010b867f;
    }
  }
  else {
    if (this->m_patternType != PATTERNTYPE_UNICOLORED_QUAD) {
      iVar2 = this->m_iteration;
LAB_010b867f:
      this->m_iteration = iVar2 + 1;
      return CONTINUE;
    }
    iVar2 = tcu::CommandLine::getTestIterationCount
                      (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
    if (iVar2 < 1) {
      iVar3 = 0x1d;
    }
    else {
      iVar3 = tcu::CommandLine::getTestIterationCount
                        (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
      iVar3 = iVar3 + -1;
    }
    tcu::operator*((tcu *)&quadColor,(float)this->m_iteration / (float)iVar3,&this->m_color);
    bVar1 = drawAndCheckUnicoloredQuad(this,&quadColor);
    if (bVar1) {
      iVar2 = this->m_iteration;
      if (iVar2 != iVar3) goto LAB_010b867f;
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_010b869a;
    }
  }
  this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_010b869a:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

DitheringCase::IterateResult DitheringCase::iterate (void)
{
	if (m_patternType == PATTERNTYPE_GRADIENT)
	{
		// Draw horizontal and vertical gradients.

		DE_ASSERT(m_iteration < 2);

		const bool success = drawAndCheckGradient(m_iteration == 1, m_color);

		if (!success)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		if (m_iteration == 1)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}
	else if (m_patternType == PATTERNTYPE_UNICOLORED_QUAD)
	{
		const int numQuads = m_testCtx.getCommandLine().getTestIterationCount() > 0 ? m_testCtx.getCommandLine().getTestIterationCount() : 30;

		DE_ASSERT(m_iteration < numQuads);

		const Vec4 quadColor	= (float)m_iteration / (float)(numQuads-1) * m_color;
		const bool success		=  drawAndCheckUnicoloredQuad(quadColor);

		if (!success)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		if (m_iteration == numQuads - 1)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}
	else
		DE_ASSERT(false);

	m_iteration++;

	return CONTINUE;
}